

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineLayout.cpp
# Opt level: O0

void __thiscall myvk::PipelineLayout::~PipelineLayout(PipelineLayout *this)

{
  PFN_vkDestroyPipelineLayout p_Var1;
  element_type *this_00;
  VkDevice pVVar2;
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  *in_RDI;
  
  (in_RDI->
  super__Vector_base<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__PipelineLayout_005309c8;
  p_Var1 = vkDestroyPipelineLayout;
  if (in_RDI[2].
      super__Vector_base<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    this_00 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2d5645);
    pVVar2 = Device::GetHandle(this_00);
    (*p_Var1)(pVVar2,(VkPipelineLayout)
                     in_RDI[2].
                     super__Vector_base<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(VkAllocationCallbacks *)0x0
             );
  }
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector(in_RDI);
  std::shared_ptr<myvk::Device>::~shared_ptr((shared_ptr<myvk::Device> *)0x2d568d);
  DeviceObjectBase::~DeviceObjectBase((DeviceObjectBase *)0x2d5697);
  return;
}

Assistant:

PipelineLayout::~PipelineLayout() {
	if (m_pipeline_layout)
		vkDestroyPipelineLayout(m_device_ptr->GetHandle(), m_pipeline_layout, nullptr);
}